

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O0

bool amrex::operator==(BATransformer *a,BATransformer *b)

{
  IndexType IVar1;
  IndexType IVar2;
  int *in_RSI;
  BATransformer *in_RDI;
  IntVect IVar3;
  IntVect IVar4;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  int local_a8;
  int local_9c;
  int iStack_98;
  int local_88;
  int local_80;
  int iStack_7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  bool local_51;
  
  if ((in_RDI->m_bat_type == bndryReg) || (*in_RSI == 4)) {
    if ((in_RDI->m_bat_type == bndryReg) && (*in_RSI == 4)) {
      local_51 = operator==((BATbndryReg *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (BATbndryReg *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    else {
      local_51 = false;
    }
  }
  else {
    IVar1 = BATransformer::index_type
                      ((BATransformer *)
                       CONCAT17(in_stack_ffffffffffffff4f,
                                CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    IVar2 = BATransformer::index_type
                      ((BATransformer *)
                       CONCAT17(in_stack_ffffffffffffff4f,
                                CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    local_51 = false;
    if (IVar2.itype == IVar1.itype) {
      IVar3 = BATransformer::coarsen_ratio(in_RDI);
      local_88 = IVar3.vect[2];
      IVar4 = BATransformer::coarsen_ratio(in_RDI);
      local_a8 = IVar4.vect[2];
      local_80 = IVar3.vect[0];
      local_9c = IVar4.vect[0];
      local_51 = false;
      if (local_80 == local_9c) {
        iStack_7c = IVar3.vect[1];
        iStack_98 = IVar4.vect[1];
        local_51 = false;
        if (iStack_7c == iStack_98) {
          local_51 = local_88 == local_a8;
        }
      }
    }
  }
  return local_51;
}

Assistant:

bool operator== (BATransformer const& a, BATransformer const& b) noexcept {
        if (a.m_bat_type != BATType::bndryReg && b.m_bat_type != BATType::bndryReg) {
            return a.index_type() == b.index_type()
                && a.coarsen_ratio() == b.coarsen_ratio();
        } else if (a.m_bat_type == BATType::bndryReg && b.m_bat_type == BATType::bndryReg) {
            return a.m_op.m_bndryReg == b.m_op.m_bndryReg;
        } else {
            return false;
        }
    }